

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddBtreeIndex(WhereLoopBuilder *pBuilder,SrcItem *pSrc,Index *pProbe,LogEst nInMul)

{
  byte *pbVar1;
  ushort uVar2;
  u16 uVar3;
  u16 uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  LogEst N;
  uint uVar8;
  uint uVar9;
  Parse *pParse;
  sqlite3 *db;
  WhereLoop *p;
  ulong uVar10;
  Expr *pEVar11;
  Expr *pExpr;
  u32 opMask;
  short nInMul_00;
  byte bVar12;
  char cVar13;
  char cVar14;
  LogEst a;
  LogEst N_00;
  u16 uVar15;
  ushort uVar16;
  LogEst LVar17;
  short sVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  WhereTerm *pTerm;
  Select *pSVar25;
  CollSeq *pCVar26;
  int n;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  u64 x;
  long lVar30;
  ushort uVar31;
  WhereTerm *local_110;
  WhereTerm *local_100;
  WhereScan scan;
  
  pParse = pBuilder->pWInfo->pParse;
  if (pParse->nErr != 0) {
    return pParse->rc;
  }
  db = pParse->db;
  p = pBuilder->pNew;
  uVar8 = p->wsFlags;
  uVar23 = 0x18;
  if ((uVar8 & 0x20) == 0) {
    uVar23 = 0x1bf;
  }
  opMask = uVar23 & 0xffffff83;
  if ((*(ushort *)&pProbe->field_0x63 & 4) == 0) {
    opMask = uVar23;
  }
  uVar2 = (p->u).btree.nEq;
  uVar3 = (p->u).btree.nBtm;
  uVar4 = (p->u).btree.nTop;
  uVar5 = p->nSkip;
  uVar6 = p->nLTerm;
  uVar10 = p->prereq;
  uVar7 = p->nOut;
  pTerm = whereScanInit(&scan,pBuilder->pWC,pSrc->iCursor,(uint)uVar2,opMask,pProbe);
  p->rSetup = 0;
  N = *pProbe->aiRowLogEst;
  a = estLog(N);
  n = uVar6 + 1;
  local_110 = (WhereTerm *)0x0;
  local_100 = (WhereTerm *)0x0;
  iVar24 = 0;
LAB_00186cb7:
  uVar23 = (uint)uVar2;
  if ((iVar24 != 0) || (pTerm == (WhereTerm *)0x0)) goto LAB_0018739c;
  uVar16 = pTerm->eOperator;
  if ((uVar16 == 0x100) || ((pTerm->wtFlags & 0x80) != 0)) {
    iVar19 = indexColumnNotNull(pProbe,uVar23);
    iVar24 = 0;
    if (iVar19 == 0) goto LAB_00186cf5;
    goto LAB_00187288;
  }
LAB_00186cf5:
  uVar28 = p->maskSelf;
  iVar19 = 0;
  iVar24 = 0;
  if ((((pTerm->prereqRight & uVar28) != 0) ||
      ((iVar24 = iVar19, uVar16 == 0x10 && ((pTerm->wtFlags & 0x100) != 0)))) ||
     ((((pSrc->fg).jointype & 0x58) != 0 &&
      (iVar19 = constraintCompatibleWithOuterJoin(pTerm,pSrc), iVar19 == 0)))) goto LAB_00187288;
  if ((pProbe->onError == '\0') || (bVar12 = 2, pProbe->nKeyCol - 1 != uVar23)) {
    bVar12 = 1;
  }
  pBuilder->bldFlags1 = pBuilder->bldFlags1 | bVar12;
  p->wsFlags = uVar8;
  (p->u).btree.nEq = uVar2;
  (p->u).btree.nBtm = uVar3;
  (p->u).btree.nTop = uVar4;
  p->nLTerm = uVar6;
  uVar20 = (uint)uVar6;
  if (p->nLSlot <= uVar6) {
    iVar19 = whereLoopResize(db,p,n);
    if (iVar19 != 0) {
      iVar24 = 0;
LAB_0018739c:
      p->prereq = uVar10;
      (p->u).btree.nEq = uVar2;
      (p->u).btree.nBtm = uVar3;
      (p->u).btree.nTop = uVar4;
      p->nSkip = uVar5;
      p->wsFlags = uVar8;
      p->nOut = uVar7;
      p->nLTerm = uVar6;
      if (uVar2 != uVar5) {
        return iVar24;
      }
      if (uVar2 != uVar6 || (uint)pProbe->nKeyCol <= uVar23 + 1) {
        return iVar24;
      }
      if ((*(ushort *)&pProbe->field_0x63 & 0xc0) != 0x80) {
        return iVar24;
      }
      if ((db->dbOptFlags & 0x4000) != 0) {
        return iVar24;
      }
      if (pProbe->aiRowLogEst[(ulong)uVar2 + 1] < 0x2a) {
        return iVar24;
      }
      iVar24 = whereLoopResize(db,p,n);
      if (iVar24 != 0) {
        return iVar24;
      }
      (p->u).btree.nEq = (p->u).btree.nEq + 1;
      uVar23._0_2_ = p->nLTerm;
      uVar23._2_2_ = p->nSkip;
      p->nLTerm = (undefined2)uVar23 + 1;
      p->nSkip = uVar23._2_2_ + 1;
      p->aLTerm[uVar23 & 0xffff] = (WhereTerm *)0x0;
      pbVar1 = (byte *)((long)&p->wsFlags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      sVar18 = pProbe->aiRowLogEst[uVar2] - pProbe->aiRowLogEst[(ulong)uVar2 + 1];
      p->nOut = p->nOut - sVar18;
      whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul + sVar18 + 5);
      p->nOut = uVar7;
      (p->u).btree.nEq = uVar2;
      p->nSkip = uVar2;
      p->wsFlags = uVar8;
      return 0;
    }
    uVar20 = (uint)p->nLTerm;
    uVar28 = p->maskSelf;
  }
  uVar31 = (ushort)(uVar20 + 1);
  p->nLTerm = uVar31;
  p->aLTerm[uVar20] = pTerm;
  p->prereq = ~uVar28 & (pTerm->prereqRight | uVar10);
  if ((uVar16 & 1) == 0) {
    if ((uVar16 & 0x82) == 0) {
      if ((uVar16 >> 8 & 1) == 0) {
        iVar24 = pSrc->iCursor;
        iVar21 = sqlite3ExprVectorSize(pTerm->pExpr->pLeft);
        iVar19 = pProbe->nColumn - uVar23;
        if (iVar21 < iVar19) {
          iVar19 = iVar21;
        }
        iVar21 = 1;
        if (1 < iVar19) {
          iVar21 = iVar19;
        }
        lVar30 = 8;
        for (lVar29 = 1; uVar15 = (u16)iVar21, lVar29 < iVar19; lVar29 = lVar29 + 1) {
          pSVar25 = (Select *)pTerm->pExpr->pRight;
          if ((pSVar25->selFlags & 0x1000) != 0) {
            pSVar25 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar25->pEList)->pSelect;
          }
          pEVar11 = *(Expr **)((long)((pTerm->pExpr->pLeft->x).pList)->a + lVar30 * 4 + -8);
          uVar15 = (u16)lVar29;
          if (((pEVar11->op != 0xa7) || (pEVar11->iTable != iVar24)) ||
             ((pEVar11->iColumn !=
               *(short *)((long)pProbe->aiColumn + lVar29 * 2 + (ulong)((uint)uVar2 + (uint)uVar2))
              || (pProbe->aSortOrder[lVar29 + (ulong)uVar2] != pProbe->aSortOrder[uVar2])))) break;
          pExpr = *(Expr **)((long)((anon_union_8_2_a01b6dbf_for_x *)&pSVar25->pEList)->pList->a +
                            lVar30 * 4 + -8);
          cVar13 = sqlite3ExprAffinity(pEVar11);
          cVar14 = sqlite3CompareAffinity(pExpr,cVar13);
          sVar18 = pEVar11->iColumn;
          cVar13 = 'D';
          if ((-1 < (long)sVar18) && (sVar18 < pProbe->pTable->nCol)) {
            cVar13 = pProbe->pTable->aCol[sVar18].affinity;
          }
          if (((cVar14 != cVar13) ||
              (pCVar26 = sqlite3BinaryCompareCollSeq(pParse,pEVar11,pExpr),
              pCVar26 == (CollSeq *)0x0)) ||
             (iVar22 = sqlite3StrICmp(pCVar26->zName,
                                      *(char **)((long)pProbe->azColl +
                                                lVar29 * 8 + (ulong)((uint)uVar2 * 8))), iVar22 != 0
             )) break;
          lVar30 = lVar30 + 6;
        }
        uVar9 = p->wsFlags;
        if ((uVar16 & 0x24) == 0) {
          uVar20 = uVar9 | 0x12;
          p->wsFlags = uVar20;
          (p->u).btree.nTop = uVar15;
          if ((uVar9 & 0x20) == 0) {
            local_110 = (WhereTerm *)0x0;
          }
          else {
            local_110 = p->aLTerm[(ulong)p->nLTerm - 2];
          }
          N_00 = 0;
          local_100 = pTerm;
        }
        else {
          uVar20 = uVar9 | 0x22;
          p->wsFlags = uVar20;
          (p->u).btree.nBtm = uVar15;
          iVar24 = 0;
          local_110 = pTerm;
          if ((pTerm->wtFlags & 0x100) != 0) {
            iVar19 = whereLoopResize(db,p,p->nLTerm + 1);
            if (iVar19 == 0) {
              uVar31 = p->nLTerm;
              p->nLTerm = uVar31 + 1;
              p->aLTerm[uVar31] = pTerm + 1;
              uVar20 = p->wsFlags | 0x10;
              p->wsFlags = uVar20;
              (p->u).btree.nTop = 1;
              N_00 = 0;
              local_100 = pTerm + 1;
              goto LAB_001870c1;
            }
            goto LAB_0018739c;
          }
          N_00 = 0;
          local_100 = (WhereTerm *)0x0;
        }
        goto LAB_001870c1;
      }
      uVar20 = p->wsFlags | 8;
LAB_001870ba:
      p->wsFlags = uVar20;
    }
    else {
      sVar18 = pProbe->aiColumn[uVar2];
      uVar9 = p->wsFlags;
      uVar20 = uVar9 | 1;
      p->wsFlags = uVar20;
      uVar27 = 0x1001;
      if (sVar18 == -1) {
LAB_00186e4f:
        uVar20 = uVar9 | uVar27;
        p->wsFlags = uVar20;
      }
      else if (((nInMul == 0) && (-1 < sVar18)) && (pProbe->nKeyCol - 1 == uVar23)) {
        if (((pProbe->field_0x63 & 8) == 0) &&
           (((pProbe->nKeyCol != 1 || (uVar16 != 2)) || (pProbe->onError == '\0')))) {
          uVar27 = 0x10001;
        }
        goto LAB_00186e4f;
      }
      if (1 < scan.iEquiv) {
        uVar20 = uVar20 | 0x200000;
        goto LAB_001870ba;
      }
    }
    N_00 = 0;
  }
  else {
    pEVar11 = pTerm->pExpr;
    if ((pEVar11->flags & 0x1000) == 0) {
      N_00 = 0;
      if (((pEVar11->x).pList != (ExprList *)0x0) &&
         (x = (u64)((pEVar11->x).pList)->nExpr, N_00 = 0, x != 0)) {
        N_00 = sqlite3LogEst(x);
      }
    }
    else {
      uVar23 = 1;
      if (1 < uVar31) {
        uVar23 = uVar20 + 1;
      }
      N_00 = 0x2e;
      for (uVar28 = 0; (uVar23 & 0xffff) - 1 != uVar28; uVar28 = uVar28 + 1) {
        if ((p->aLTerm[uVar28] != (WhereTerm *)0x0) && (p->aLTerm[uVar28]->pExpr == pEVar11)) {
          N_00 = 0;
        }
      }
    }
    if ((((pProbe->field_0x63 & 0x80) != 0) && (9 < a)) &&
       (sVar18 = pProbe->aiRowLogEst[uVar2], LVar17 = estLog(N_00),
       (short)((sVar18 - (N_00 + a)) + LVar17 + 10) < 0)) {
      if ((1 < nInMul) || ((db->dbOptFlags & 0x20000) != 0)) goto LAB_00187288;
      pbVar1 = (byte *)((long)&p->wsFlags + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
    uVar20 = p->wsFlags | 4;
    p->wsFlags = uVar20;
  }
LAB_001870c1:
  if ((uVar20 & 2) == 0) {
    uVar23 = (p->u).vtab.idxNum + 1;
    (p->u).btree.nEq = (u16)uVar23;
    if ((pTerm->truthProb < 1) && (-1 < pProbe->aiColumn[uVar2])) {
      uVar23 = (uint)(ushort)((pTerm->truthProb - N_00) + p->nOut);
      goto LAB_00187178;
    }
    uVar28 = (ulong)(uVar23 & 0xffff);
    uVar31 = (pProbe->aiRowLogEst[uVar28] - pProbe->aiRowLogEst[uVar28 - 1]) + p->nOut;
    p->nOut = uVar31;
    if ((uVar16 >> 8 & 1) != 0) {
      uVar23 = uVar31 + 10;
      goto LAB_00187178;
    }
  }
  else {
    sVar18 = p->nOut;
    LVar17 = whereRangeAdjust(local_110,sVar18);
    uVar31 = whereRangeAdjust(local_100,LVar17);
    uVar16 = uVar31;
    if ((((local_110 != (WhereTerm *)0x0) && (local_100 != (WhereTerm *)0x0)) &&
        (0 < local_110->truthProb)) && (uVar16 = uVar31 - 0x14, local_100->truthProb < 1)) {
      uVar16 = uVar31;
    }
    uVar23 = (-1 - (uint)(local_110 != (WhereTerm *)0x0)) + (uint)(local_100 == (WhereTerm *)0x0) +
             (int)sVar18;
    uVar31 = 10;
    if (10 < (short)uVar16) {
      uVar31 = uVar16;
    }
    if ((int)(uint)uVar31 <= (int)uVar23) {
      uVar23 = (uint)uVar31;
    }
LAB_00187178:
    uVar31 = (ushort)uVar23;
    p->nOut = uVar31;
  }
  if ((~*(ushort *)&pProbe->field_0x63 & 3) == 0) {
    LVar17 = uVar31 + 0x10;
  }
  else {
    LVar17 = (short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow) + uVar31 + 1;
  }
  sVar18 = sqlite3LogEstAdd(a,LVar17);
  if ((uVar20 & 0x4000140) == 0) {
    sVar18 = sqlite3LogEstAdd(sVar18,uVar31 + 0x10);
  }
  nInMul_00 = N_00 + nInMul;
  p->rRun = sVar18 + nInMul_00;
  p->nOut = uVar31 + nInMul_00;
  whereLoopOutputAdjust(pBuilder->pWC,p,N);
  iVar24 = whereLoopInsert(pBuilder,p);
  if ((p->wsFlags & 2) != 0) {
    uVar31 = uVar7;
  }
  p->nOut = uVar31;
  if ((((p->wsFlags & 0x10) == 0) && (uVar16 = (p->u).btree.nEq, uVar16 < pProbe->nColumn)) &&
     ((uVar16 < pProbe->nKeyCol || ((*(ushort *)&pProbe->field_0x63 & 3) != 2)))) {
    if (3 < uVar16) {
      sqlite3ProgressCheck(pParse);
    }
    whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul_00);
  }
  p->nOut = uVar7;
LAB_00187288:
  pTerm = whereScanNext(&scan);
  goto LAB_00186cb7;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  SrcItem *pSrc,                  /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyze context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  assert( db->mallocFailed==0 || pParse->nErr>0 );
  if( pParse->nErr ){
    return pParse->rc;
  }
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d, nSkip=%d, rRun=%d\n",
                     pProbe->pTable->zName,pProbe->zName,
                     pNew->u.btree.nEq, pNew->nSkip, pNew->rRun));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );
  assert( pNew->u.btree.nEq<pProbe->nKeyCol
       || pProbe->idxType!=SQLITE_IDXTYPE_PRIMARYKEY );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    if( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0
     && !constraintCompatibleWithOuterJoin(pTerm,pSrc)
    ){
      continue;
    }
    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags1 |= SQLITE_BLDF1_UNIQUE;
    }else{
      pBuilder->bldFlags1 |= SQLITE_BLDF1_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( pNew->nLTerm>=pNew->nLSlot
     && whereLoopResize(db, pNew, pNew->nLTerm+1)
    ){
       break; /* OOM while trying to enlarge the pNew->aLTerm array */
    }
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprUseXSelect(pExpr) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
      }
      if( pProbe->hasStat1 && rLogSize>=10 ){
        LogEst M, logK, x;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.  Do not bother with this optimization on very small
        ** tables (less than 2 rows) as it is pointless in that case.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        /* TUNING      v-----  10 to bias toward indexed IN */
        x = M + logK + 10 - (nIn + rLogSize);
        if( x>=0 ){
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d) "
             "prefers indexed lookup\n",
             saved_nEq, M, logK, nIn, rLogSize, x));
        }else if( nInMul<2 && OptimizationEnabled(db, SQLITE_SeekScan) ){
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d"
             " nInMul=%d) prefers skip-scan\n",
             saved_nEq, M, logK, nIn, rLogSize, x, nInMul));
          pNew->wsFlags |= WHERE_IN_SEEKSCAN;
        }else{
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d"
             " nInMul=%d) prefers normal scan\n",
             saved_nEq, M, logK, nIn, rLogSize, x, nInMul));
          continue;
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ)
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
      if( scan.iEquiv>1 ) pNew->wsFlags |= WHERE_TRANSCONS;
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else{
      int nVecLen = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      if( eOp & (WO_GT|WO_GE) ){
        testcase( eOp & WO_GT );
        testcase( eOp & WO_GE );
        pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
        pNew->u.btree.nBtm = nVecLen;
        pBtm = pTerm;
        pTop = 0;
        if( pTerm->wtFlags & TERM_LIKEOPT ){
          /* Range constraints that come from the LIKE optimization are
          ** always used in pairs. */
          pTop = &pTerm[1];
          assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
          assert( pTop->wtFlags & TERM_LIKEOPT );
          assert( pTop->eOperator==WO_LT );
          if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
          pNew->aLTerm[pNew->nLTerm++] = pTop;
          pNew->wsFlags |= WHERE_TOP_LIMIT;
          pNew->u.btree.nTop = 1;
        }
      }else{
        assert( eOp & (WO_LT|WO_LE) );
        testcase( eOp & WO_LT );
        testcase( eOp & WO_LE );
        pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = nVecLen;
        pTop = pTerm;
        pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                       pNew->aLTerm[pNew->nLTerm-2] : 0;
      }
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat4 data. Or, if there is no stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0
         && pProbe->nSample
         && ALWAYS(pNew->u.btree.nEq<=pProbe->nSampleCol)
         && ((eOp & WO_IN)==0 || ExprUseXList(pTerm->pExpr))
         && OptimizationEnabled(db, SQLITE_Stat4)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( nEq==1
             /* TUNING: Mark terms as "low selectivity" if they seem likely
             ** to be true for half or more of the rows in the table.
             ** See tag-202002240-1 */
             && pNew->nOut+10 > pProbe->aiRowLogEst[0]
            ){
#if WHERETRACE_ENABLED /* 0x01 */
              if( sqlite3WhereTrace & 0x20 ){
                sqlite3DebugPrintf(
                   "STAT4 determines term has low selectivity:\n");
                sqlite3WhereTermPrint(pTerm, 999);
              }
#endif
              pTerm->wtFlags |= TERM_HIGHTRUTH;
              if( pTerm->wtFlags & TERM_HEURTRUTH ){
                /* If the term has previously been used with an assumption of
                ** higher selectivity, then set the flag to rerun the
                ** loop computations. */
                pBuilder->bldFlags2 |= SQLITE_BLDF2_2NDPASS;
              }
            }
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a
            ** "col IS NULL" expression matches twice as many rows
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    assert( pSrc->pTab->szTabRow>0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* The pProbe->szIdxRow is low for an IPK table since the interior
      ** pages are small.  Thus szIdxRow gives a good estimate of seek cost.
      ** But the leaf pages are full-size, so pProbe->szIdxRow would badly
      ** under-estimate the scanning cost. */
      rCostIdx = pNew->nOut + 16;
    }else{
      rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    }
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK|WHERE_EXPRIDX))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
     && (pNew->u.btree.nEq<pProbe->nKeyCol ||
           pProbe->idxType!=SQLITE_IDXTYPE_PRIMARYKEY)
    ){
      if( pNew->u.btree.nEq>3 ){
        sqlite3ProgressCheck(pParse);
      }
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18.
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower.
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && saved_nEq==pNew->nLTerm
   && pProbe->noSkipScan==0
   && pProbe->hasStat1!=0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}